

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O1

DecodeStatus DecodeAdrInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  DecodeStatus extraout_EAX;
  uint uVar2;
  
  uVar2 = insn >> 3 & 0x1ffffc;
  uVar1 = uVar2 - 0x200000;
  if ((insn >> 0x17 & 1) == 0) {
    uVar1 = uVar2;
  }
  MCOperand_CreateReg0(Inst,GPR64DecoderTable[insn & 0x1f]);
  MCOperand_CreateImm0(Inst,(long)(int)(uVar1 + (insn >> 0x1d & 3)));
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeAdrInstruction(MCInst *Inst, uint32_t insn,
		uint64_t Addr, void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	int32_t imm = fieldFromInstruction(insn, 5, 19) << 2;

	imm |= fieldFromInstruction(insn, 29, 2);

	// Sign-extend the 21-bit immediate.
	if (imm & (1 << (21 - 1)))
		imm |= ~((1LL << 21) - 1);

	DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
	//if (!Dis->tryAddingSymbolicOperand(Inst, imm, Addr, Fail, 0, 4))
	MCOperand_CreateImm0(Inst, imm);

	return Success;
}